

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O3

void gl4cts::EnhancedLayouts::Utils::replaceAllTokens(GLchar *token,GLchar *text,string *string)

{
  size_t sVar1;
  char *pcVar2;
  ulong uVar3;
  ulong uVar4;
  
  sVar1 = strlen(text);
  pcVar2 = (char *)strlen(token);
  strlen(token);
  uVar4 = 0;
  while( true ) {
    uVar3 = std::__cxx11::string::find((char *)string,(ulong)token,uVar4);
    if (uVar3 == 0xffffffffffffffff) break;
    uVar4 = uVar3 + sVar1;
    std::__cxx11::string::replace((ulong)string,uVar3,pcVar2,(ulong)text);
    strlen(token);
  }
  return;
}

Assistant:

void replaceAllTokens(const GLchar* token, const GLchar* text, std::string& string)
{
	const size_t text_length  = strlen(text);
	const size_t token_length = strlen(token);

	size_t search_position = 0;

	while (1)
	{
		const size_t token_position = string.find(token, search_position);

		if (std::string::npos == token_position)
		{
			break;
		}

		search_position = token_position + text_length;

		string.replace(token_position, token_length, text, text_length);
	}
}